

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

void Abc_NtkTraverseSupers(Abc_ShaMan_t *p,int fAnd)

{
  Abc_Obj_t *pAVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *vInputs;
  void **ppvVar6;
  int *__s;
  Vec_Ptr_t *pVVar7;
  undefined8 *puVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  ulong uVar12;
  Abc_Ntk_t *pAVar13;
  int iVar14;
  long lVar15;
  
  pAVar13 = p->pNtk;
  iVar4 = pAVar13->vObjs->nSize;
  lVar15 = ((long)fAnd + 1) * (long)iVar4;
  vInputs = (Vec_Ptr_t *)malloc(0x10);
  iVar14 = (int)lVar15;
  iVar3 = 8;
  if (6 < iVar14 - 1U) {
    iVar3 = iVar14;
  }
  vInputs->nCap = iVar3;
  if (iVar3 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar3 << 3);
  }
  vInputs->pArray = ppvVar6;
  vInputs->nSize = iVar14;
  memset(ppvVar6,0,lVar15 * 8);
  if ((pAVar13->vTravIds).pArray == (int *)0x0) {
    uVar12 = (long)iVar4 + 500;
    iVar14 = (int)uVar12;
    if ((pAVar13->vTravIds).nCap < iVar14) {
      __s = (int *)malloc(uVar12 * 4);
      (pAVar13->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar13->vTravIds).nCap = iVar14;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar4) {
      memset(__s,0,(uVar12 & 0xffffffff) << 2);
    }
    (pAVar13->vTravIds).nSize = iVar14;
  }
  iVar4 = pAVar13->nTravIds;
  pAVar13->nTravIds = iVar4 + 1;
  if (0x3ffffffe < iVar4) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar7 = pAVar13->vCos;
  if (fAnd == 0) {
    if (0 < pVVar7->nSize) {
      lVar15 = 0;
      do {
        pAVar1 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*pVVar7->pArray[lVar15] + 0x20) + 8) +
                  (long)**(int **)((long)pVVar7->pArray[lVar15] + 0x20) * 8);
        if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7) {
          Abc_NtkTraverseSupersXor_rec(p,pAVar1,vInputs);
          pAVar13 = p->pNtk;
        }
        lVar15 = lVar15 + 1;
        pVVar7 = pAVar13->vCos;
      } while (lVar15 < pVVar7->nSize);
    }
  }
  else if (0 < pVVar7->nSize) {
    lVar15 = 0;
    do {
      pAVar1 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar7->pArray[lVar15] + 0x20) + 8) +
                (long)**(int **)((long)pVVar7->pArray[lVar15] + 0x20) * 8);
      if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7) {
        Abc_NtkTraverseSupersAnd_rec(p,pAVar1,vInputs);
        pAVar13 = p->pNtk;
      }
      lVar15 = lVar15 + 1;
      pVVar7 = pAVar13->vCos;
    } while (lVar15 < pVVar7->nSize);
  }
  p->nStartCols = p->vObj2Lit->nSize;
  if ((long)vInputs->nSize < 1) {
    uVar5 = 0;
  }
  else {
    lVar15 = 0;
    uVar5 = 0;
    do {
      if ((vInputs->pArray[lVar15] != (void *)0x0) &&
         (uVar11 = *(int *)((long)vInputs->pArray[lVar15] + 4) - 2, (int)uVar5 <= (int)uVar11)) {
        uVar5 = uVar11;
      }
      lVar15 = lVar15 + 1;
    } while (vInputs->nSize != lVar15);
  }
  if (p->vBuckets != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vBuckets == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcExtract.c"
                  ,0x158,"void Abc_NtkTraverseSupers(Abc_ShaMan_t *, int)");
  }
  uVar11 = uVar5 + 1;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar5) {
    uVar12 = (ulong)uVar11;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = (int)uVar12;
  ppvVar6 = (void **)malloc(uVar12 << 3);
  pVVar7->pArray = ppvVar6;
  p->vBuckets = pVVar7;
  do {
    pVVar7 = p->vBuckets;
    puVar8 = (undefined8 *)malloc(0x10);
    *puVar8 = 10;
    pvVar9 = malloc(0x50);
    puVar8[1] = pvVar9;
    uVar5 = pVVar7->nSize;
    if (uVar5 == pVVar7->nCap) {
      if ((int)uVar5 < 0x10) {
        if (pVVar7->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
        }
        pVVar7->pArray = ppvVar6;
        pVVar7->nCap = 0x10;
      }
      else {
        if (pVVar7->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar5 << 4);
        }
        pVVar7->pArray = ppvVar6;
        pVVar7->nCap = uVar5 * 2;
      }
    }
    else {
      ppvVar6 = pVVar7->pArray;
    }
    iVar4 = pVVar7->nSize;
    pVVar7->nSize = iVar4 + 1;
    ppvVar6[iVar4] = puVar8;
    uVar11 = uVar11 - 1;
  } while (uVar11 != 0);
  iVar4 = vInputs->nSize;
  if (0 < iVar4) {
    lVar15 = 0;
    do {
      pvVar9 = vInputs->pArray[lVar15];
      if (pvVar9 != (void *)0x0) {
        if (*(int *)((long)pvVar9 + 4) < 2) {
LAB_00262003:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar5 = *(int *)((long)pvVar9 + 4) - 2;
        if (p->vBuckets->nSize <= (int)uVar5) goto LAB_00262003;
        puVar2 = (uint *)p->vBuckets->pArray[uVar5];
        uVar5 = puVar2[1];
        if (uVar5 == *puVar2) {
          if ((int)uVar5 < 0x10) {
            if (*(void **)(puVar2 + 2) == (void *)0x0) {
              pvVar10 = malloc(0x80);
            }
            else {
              pvVar10 = realloc(*(void **)(puVar2 + 2),0x80);
            }
            *(void **)(puVar2 + 2) = pvVar10;
            *puVar2 = 0x10;
          }
          else {
            if (*(void **)(puVar2 + 2) == (void *)0x0) {
              pvVar10 = malloc((ulong)uVar5 << 4);
            }
            else {
              pvVar10 = realloc(*(void **)(puVar2 + 2),(ulong)uVar5 << 4);
            }
            *(void **)(puVar2 + 2) = pvVar10;
            *puVar2 = uVar5 * 2;
          }
        }
        else {
          pvVar10 = *(void **)(puVar2 + 2);
        }
        uVar5 = puVar2[1];
        puVar2[1] = uVar5 + 1;
        *(void **)((long)pvVar10 + (long)(int)uVar5 * 8) = pvVar9;
        iVar4 = vInputs->nSize;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar4);
  }
  if (vInputs->pArray != (void **)0x0) {
    free(vInputs->pArray);
  }
  free(vInputs);
  return;
}

Assistant:

void Abc_NtkTraverseSupers( Abc_ShaMan_t * p, int fAnd )
{
    Vec_Ptr_t * vInputs;
    Vec_Int_t * vInput;
    Abc_Obj_t * pObj;
    int i, nOnesMax;

    // create mapping of nodes into their column vectors
    vInputs = Vec_PtrStart( Abc_NtkObjNumMax(p->pNtk) * (1 + fAnd) );
    Abc_NtkIncrementTravId( p->pNtk );
    if ( fAnd )
    {
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
                Abc_NtkTraverseSupersAnd_rec( p, Abc_ObjFanin0(pObj), vInputs );
    }
    else
    {
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
                Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin0(pObj), vInputs );
    }
    p->nStartCols = Vec_IntSize(p->vObj2Lit);

    // find the largest number of 1s
    nOnesMax = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vInputs, vInput, i )
        if ( vInput )
            nOnesMax = Abc_MaxInt( nOnesMax, Vec_IntSize(vInput)-SHARE_NUM );

    // create buckets
    assert( p->vBuckets == NULL );
    p->vBuckets = Vec_PtrAlloc( nOnesMax + 1 );
    for ( i = 0; i <= nOnesMax; i++ )
        Vec_PtrPush( p->vBuckets, Vec_PtrAlloc(10) );

    // load vectors into buckets
    Vec_PtrForEachEntry( Vec_Int_t *, vInputs, vInput, i )
        if ( vInput )
            Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vInput)-SHARE_NUM), vInput );
    Vec_PtrFree( vInputs );
}